

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

void __thiscall IRT::TreePattern::~TreePattern(TreePattern *this)

{
  this->_vptr_TreePattern = (_func_int **)&PTR__TreePattern_0017bc88;
  std::__cxx11::string::~string((string *)&this->stringRepresentation);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->treeRepresentation).super___shared_ptr<IRT::INode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

IRT::TreePattern::~TreePattern( ) {
}